

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

RTPTransmissionInfo * __thiscall
jrtplib::RTPFakeTransmitter::GetTransmissionInfo(RTPFakeTransmitter *this)

{
  RTPMemoryManager *pRVar1;
  _List_node_base *p_Var2;
  RTPFakeTransmissionInfo *this_00;
  list<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  if (this->init == true) {
    pRVar1 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      this_00 = (RTPFakeTransmissionInfo *)operator_new(0x30);
    }
    else {
      this_00 = (RTPFakeTransmissionInfo *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x30,0x1c);
    }
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list(&local_40,&this->localIPs)
    ;
    RTPFakeTransmissionInfo::RTPFakeTransmissionInfo(this_00,&local_40,this->params);
    while (local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
           super__List_node_base._M_next != (_List_node_base *)&local_40) {
      p_Var2 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                &(local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      ._M_node.super__List_node_base._M_next,0x18);
      local_40.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = p_Var2;
    }
  }
  else {
    this_00 = (RTPFakeTransmissionInfo *)0x0;
  }
  return &this_00->super_RTPTransmissionInfo;
}

Assistant:

RTPTransmissionInfo *RTPFakeTransmitter::GetTransmissionInfo()
{
	if (!init)
		return 0;

	MAINMUTEX_LOCK
	RTPTransmissionInfo *tinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPTRANSMISSIONINFO) RTPFakeTransmissionInfo(localIPs, params);
	MAINMUTEX_UNLOCK
	return tinf;
}